

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidPooling3dNegativeKernelSize(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  ostream *poVar3;
  Result local_a8;
  Pooling3DLayerParams *mutablePooling3d;
  NeuralNetworkLayer *pooling3dLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out3 = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,10);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,0xb);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,0xc);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,0xd);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,0xe);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"probs");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pooling3dLayer =
       (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)pooling3dLayer,EXACT_ARRAY_MAPPING);
  mutablePooling3d =
       (Pooling3DLayerParams *)
       CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)pooling3dLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)mutablePooling3d,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)mutablePooling3d,"probs");
  local_a8.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_pooling3d
                 ((NeuralNetworkLayer *)mutablePooling3d);
  CoreML::Specification::Pooling3DLayerParams::set_kerneldepth
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,2);
  CoreML::Specification::Pooling3DLayerParams::set_kernelheight
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,2);
  CoreML::Specification::Pooling3DLayerParams::set_kernelwidth
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,-1);
  CoreML::Specification::Pooling3DLayerParams::set_stridedepth
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,5);
  CoreML::Specification::Pooling3DLayerParams::set_strideheight
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,5);
  CoreML::Specification::Pooling3DLayerParams::set_stridewidth
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,5);
  CoreML::Specification::Pooling3DLayerParams::set_paddingtype
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,
             Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingfront
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingback
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingtop
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingbottom
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingleft
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,7);
  CoreML::Specification::Pooling3DLayerParams::set_custompaddingright
            ((Pooling3DLayerParams *)local_a8.m_message._M_storage._M_storage,7);
  CoreML::validate<(MLModelType)500>(&local_a8,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_a8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4d5);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_a8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidPooling3dNegativeKernelSize() {
    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    // Adding 5 shapes for a rank 5 input.
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);
    shape->add_shape(13);
    shape->add_shape(14);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(CoreML::Specification::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *pooling3dLayer = nn->add_layers();
    pooling3dLayer->add_input("input");
    pooling3dLayer->add_output("probs");
    auto *mutablePooling3d = pooling3dLayer->mutable_pooling3d();
    
    // Add Kernel sizes
    mutablePooling3d->set_kerneldepth(2);
    mutablePooling3d->set_kernelheight(2);
    mutablePooling3d->set_kernelwidth(-1);

    // Add Strides
    mutablePooling3d->set_stridedepth(5);
    mutablePooling3d->set_strideheight(5);
    mutablePooling3d->set_stridewidth(5);

    // Add 6 Custom Paddings
    mutablePooling3d->set_paddingtype(CoreML::Specification::Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM);
    mutablePooling3d->set_custompaddingfront(7);
    mutablePooling3d->set_custompaddingback(7);
    mutablePooling3d->set_custompaddingtop(7);
    mutablePooling3d->set_custompaddingbottom(7);
    mutablePooling3d->set_custompaddingleft(7);
    mutablePooling3d->set_custompaddingright(7);
    
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    
    return 0;
}